

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O1

int Imf_3_4::pixelTypeSize(PixelType type)

{
  ArgExc *this;
  
  if (type < NUM_PIXELTYPES) {
    return *(int *)(&DAT_001b6ecc + (ulong)type * 4);
  }
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel type.");
  __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

int
pixelTypeSize (PixelType type)
{
    int size;

    switch (type)
    {
        case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            size = Xdr::size<unsigned int> ();
            break;

        case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            size = Xdr::size<half> ();
            break;

        case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            size = Xdr::size<float> ();
            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel type.");
    }

    return size;
}